

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Compiler::processScope
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  InstructionGenerator *this_00;
  Parser *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  vector<Scope,_std::allocator<Scope>_> *this_03;
  ScopeType SVar1;
  int iVar2;
  pointer pSVar3;
  pointer puVar4;
  const_iterator __last;
  pointer ppVar5;
  pointer pSVar6;
  pointer puVar7;
  VirtualStack *this_04;
  bool bVar8;
  DataType varType;
  int iVar9;
  uint uVar10;
  iterator __position;
  unsigned_long_long uVar11;
  Variable *pVVar12;
  string *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long lVar14;
  pointer pvVar15;
  uint uVar16;
  pointer ppVar17;
  vector<Scope,std::allocator<Scope>> *this_05;
  string *psVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_229;
  VirtualStack *local_228;
  Parser *local_220;
  string arrayName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  argumentNames;
  string arraySize;
  anon_class_16_2_1156e026 clearScopeVariables;
  Scope newScope;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar8 = std::operator==((line->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"{");
  if (bVar8) {
    Scope::Scope(&newScope,&this->expectedScopeType);
    newScope.startPos =
         (uint)((ulong)((long)(this->bytecode).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->bytecode).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2);
    newScope.scopeDepth = this->scopeDepth;
    newScope.stackSize = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
    SVar1 = (this->expectedScopeType).type;
    if (SVar1 == FUNCTION) {
      argumentNames.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      argumentNames.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      argumentNames.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_b0,(string *)&newScope.incrementor);
      this_01 = &this->parser;
      Parser::extractBracketArguments(&arguments,this_01,&local_b0);
      local_228 = &(this->igen).super_VirtualStack;
      local_220 = this_01;
      Parser::tokenizeFile(this_01,&arguments,&argumentNames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arguments);
      std::__cxx11::string::~string((string *)&local_b0);
      pvVar15 = argumentNames.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while (pvVar15 !=
             argumentNames.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) {
        varType = stringToDataType(pvVar15[-1].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        psVar18 = pvVar15[-1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
        bVar8 = Parser::isArrayDefinition(local_220,psVar18);
        pvVar15 = pvVar15 + -1;
        if (bVar8) {
          arrayName._M_dataplus._M_p = (pointer)&arrayName.field_2;
          arrayName._M_string_length = 0;
          arrayName.field_2._M_allocated_capacity =
               arrayName.field_2._M_allocated_capacity & 0xffffffffffffff00;
          arraySize._M_dataplus._M_p = (pointer)&arraySize.field_2;
          arraySize._M_string_length = 0;
          arraySize.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string((string *)&local_50,(string *)psVar18);
          Parser::splitArrayDefinition(local_220,&local_50,&arrayName,&arraySize);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string((string *)&local_90,(string *)&arraySize);
          iVar9 = VirtualStack::isVariable(local_228,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          if (0 < iVar9) {
            psVar13 = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      (psVar13,"Arrays of a dynamic size are not currently supported sorry!",
                       (allocator *)&arguments);
            __cxa_throw(psVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          uVar11 = std::__cxx11::stoull(&arraySize,(size_t *)0x0,10);
          uVar16 = (uint)uVar11;
          if (uVar16 == 0) {
            psVar13 = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      (psVar13,"Array must not contain no elements",(allocator *)&arguments);
            __cxa_throw(psVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          Variable::Variable((Variable *)&arguments,&arrayName,varType);
          this_04 = local_228;
          VirtualStack::push(local_228,(Variable *)&arguments);
          std::__cxx11::string::~string
                    ((string *)
                     &arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          uVar10 = VirtualStack::getStackSize(this_04);
          pVVar12 = VirtualStack::getVariable(this_04,uVar10 - 1);
          pVVar12->isArray = true;
          pVVar12->arrayLength = uVar16;
          while (uVar16 = uVar16 - 1, uVar16 != 0) {
            std::__cxx11::string::string((string *)&clearScopeVariables,"",&local_229);
            Variable::Variable((Variable *)&arguments,(string *)&clearScopeVariables,varType);
            VirtualStack::push(local_228,(Variable *)&arguments);
            std::__cxx11::string::~string
                      ((string *)
                       &arguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            std::__cxx11::string::~string((string *)&clearScopeVariables);
          }
          std::__cxx11::string::~string((string *)&arraySize);
          psVar18 = &arrayName;
        }
        else {
          Variable::Variable((Variable *)&arguments,psVar18,varType);
          VirtualStack::push(local_228,(Variable *)&arguments);
          psVar18 = (string *)
                    &arguments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        std::__cxx11::string::~string((string *)psVar18);
      }
      newScope.argumentCount =
           (uint)(((long)argumentNames.
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15) / 0x18);
      std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                ((vector<Scope,std::allocator<Scope>> *)&this->functionCallStack,&newScope);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&argumentNames);
    }
    else if (SVar1 == ELSE) {
      pSVar3 = (this->pastScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar16 = pSVar3[-1].endPos;
      puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this_02 = &this->bytecode;
      pSVar3[-1].endPos = uVar16 + 1;
      arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (this_02,(const_iterator)(puVar4 + uVar16),(value_type_conflict *)&arguments);
      puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar16 = pSVar3[-1].endPos;
      pSVar3[-1].endPos = uVar16 + 1;
      arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (int)((ulong)((long)(this->bytecode).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2) + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (this_02,(const_iterator)(puVar4 + uVar16),(value_type_conflict *)&arguments);
      puVar4 = (this_02->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + (pSVar3[-1].startPos - 1);
      *puVar4 = *puVar4 + 2;
    }
    std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
              ((vector<Scope,std::allocator<Scope>> *)&this->openScopeStack,&newScope);
    this->scopeDepth = this->scopeDepth + 1;
    Scope::~Scope(&newScope);
  }
  else {
    bVar8 = std::operator==((line->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"}");
    if (!bVar8) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newScope,
                     "Error processing scope change, unknown operator \'",
                     (line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newScope,
                     "\'");
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    iVar9 = this->scopeDepth;
    this->scopeDepth = iVar9 + -1;
    if (iVar9 < 1) {
      psVar13 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(psVar13,"No such scope to close",(allocator *)&newScope);
      __cxa_throw(psVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    local_228 = (VirtualStack *)&this->openScopeStack;
    __position._M_current =
         (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_220 = (Parser *)&this->functionCallStack;
    this_00 = &this->igen;
    this_03 = &this->pastScopes;
    do {
      if (__position._M_current ==
          (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      iVar9 = (__position._M_current)->scopeDepth;
      iVar2 = this->scopeDepth;
      if (iVar9 != iVar2) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0010559a;
      }
      puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      bVar8 = (long)__last._M_current - (long)puVar4 >> 2 !=
              (ulong)(__position._M_current)->startPos;
      uVar16 = CONCAT31((int3)((__position._M_current)->startPos >> 8),bVar8);
      if ((__position._M_current)->type != FUNCTION && !bVar8) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                  (&this->bytecode,
                   (const_iterator)(puVar4 + (__position._M_current)->bytecodeSizeBefore),__last);
        (__position._M_current)->wasOptimisedOut = true;
        (__position._M_current)->endPos =
             (uint)((ulong)((long)(this->bytecode).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->bytecode).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                  ((vector<Scope,std::allocator<Scope>> *)this_03,__position._M_current);
        std::__cxx11::string::string
                  ((string *)&newScope,
                   "Empty scope. It has been optimised out, but removal is recommended.",
                   (allocator *)&arguments);
        displayWarning(this,(string *)&newScope);
        std::__cxx11::string::~string((string *)&newScope);
        return;
      }
      clearScopeVariables.this = this;
      clearScopeVariables.current = __position._M_current;
      switch((__position._M_current)->type) {
      case IF:
        processScope::anon_class_16_2_1156e026::operator()(&clearScopeVariables,uVar16);
        goto LAB_00105508;
      case WHILE:
        processScope::anon_class_16_2_1156e026::operator()(&clearScopeVariables,uVar16);
        InstructionGenerator::genGoto(this_00,(__position._M_current)->statementPos);
LAB_00105508:
        puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4[(__position._M_current)->startPos - 1] =
             (int)((ulong)((long)(this->bytecode).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2) - 1
        ;
        break;
      case ELSE:
        processScope::anon_class_16_2_1156e026::operator()(&clearScopeVariables,uVar16);
        pSVar3 = (this->pastScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pSVar3[-1].wasOptimisedOut == false) {
          puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar4[pSVar3[-1].endPos - 1] =
               (uint)((ulong)((long)(this->bytecode).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2);
        }
        break;
      case FOR:
        processScope::anon_class_16_2_1156e026::operator()(&clearScopeVariables,uVar16);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(__position._M_current)->incrementor);
        Parser::extractBracketArguments(&arguments,&this->parser,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        arrayName._M_dataplus._M_p = (pointer)0x0;
        arrayName._M_string_length = 0;
        arrayName.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string
                  ((string *)&newScope,
                   (string *)
                   CONCAT44(arguments.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)arguments.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
        __l._M_len = 1;
        __l._M_array = (iterator)&newScope;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&arraySize,__l,(allocator_type *)&argumentNames);
        Parser::tokenizeFile
                  (&this->parser,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&arraySize,
                   (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&arrayName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arraySize);
        std::__cxx11::string::~string((string *)&newScope);
        processVariable(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)arrayName._M_dataplus._M_p);
        InstructionGenerator::genGoto(this_00,(__position._M_current)->statementPos);
        puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4[(__position._M_current)->startPos - 1] =
             (int)((ulong)((long)(this->bytecode).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2) - 1
        ;
        InstructionGenerator::genStackWalk
                  (this_00,(__position._M_current)->initialisationVariableCount);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&arrayName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&arguments);
        break;
      case FUNCTION:
        Scope::Scope(&newScope,
                     (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1);
        std::vector<Scope,_std::allocator<Scope>_>::pop_back
                  ((vector<Scope,_std::allocator<Scope>_> *)local_220);
        ppVar5 = (this->functionEndGotos).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar17 = (this->functionEndGotos).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pSVar3 = (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        pSVar6 = (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar7 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        while ((ppVar17 != ppVar5 &&
               (((long)pSVar3 - (long)pSVar6) / 0xa8 == (ulong)ppVar17[-1].first))) {
          puVar4[ppVar17[-1].second] = (uint)((ulong)((long)puVar7 - (long)puVar4) >> 2);
          ppVar17 = ppVar17 + -1;
          (this->functionEndGotos).
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar17;
        }
        uVar16 = VirtualStack::getStackSize(&this_00->super_VirtualStack);
        uVar16 = uVar16 - newScope.stackSize;
        if ((uVar16 != 0) && (bVar8 = std::operator!=(&newScope.identifier,"entry"), bVar8)) {
          InstructionGenerator::genStackWalk(this_00,uVar16);
        }
        bVar8 = std::operator!=(&newScope.identifier,"entry");
        if (bVar8) {
          std::__cxx11::string::string((string *)&arrayName,"returnPoint",(allocator *)&arraySize);
          Variable::Variable((Variable *)&arguments,&arrayName,INT);
          VirtualStack::push(&this_00->super_VirtualStack,(Variable *)&arguments);
          std::__cxx11::string::~string
                    ((string *)
                     &arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          std::__cxx11::string::~string((string *)&arrayName);
          InstructionGenerator::genDynamicGoto(this_00);
        }
        Scope::~Scope(&newScope);
        break;
      default:
        psVar13 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string(psVar13,"Ending unknown scope type",(allocator *)&newScope);
        __cxa_throw(psVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      (__position._M_current)->endPos =
           (uint)((ulong)((long)(this->bytecode).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->bytecode).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      pSVar3 = (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = (long)(this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3;
      this_05 = (vector<Scope,std::allocator<Scope>> *)this_03;
      if ((1 < (ulong)(lVar14 / 0xa8)) &&
         (this_05 = (vector<Scope,std::allocator<Scope>> *)((long)pSVar3 + lVar14 + -0xd8),
         *(int *)((long)pSVar3 + lVar14 + -0x150) != 5)) {
        this_05 = (vector<Scope,std::allocator<Scope>> *)this_03;
      }
      std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>(this_05,__position._M_current);
      __position = std::vector<Scope,_std::allocator<Scope>_>::erase
                             ((vector<Scope,_std::allocator<Scope>_> *)local_228,
                              __position._M_current);
LAB_0010559a:
    } while (iVar9 != iVar2);
  }
  return;
}

Assistant:

void Compiler::processScope(const std::vector<std::string> &line)
{
    if(line[0] == "{") //Scope open
    {
        //Setup the new scope, taking details from the expected scope and filling in the '{' dependent stuff
        Scope newScope = expectedScopeType;
        newScope.startPos = bytecode.size();
        newScope.scopeDepth = scopeDepth;
        newScope.stackSize = igen.getStackSize();

        if(expectedScopeType.type == Scope::ELSE)
        {
            Scope &previousScope = pastScopes.back(); // Get preceding scope
            bytecode.insert(bytecode.begin() + previousScope.endPos++, Instruction::GOTO);
            bytecode.insert(bytecode.begin() + previousScope.endPos++, bytecode.size()+1); //Temporary value, this will be filled in later.
            bytecode[previousScope.startPos-1] += 2;
        }
        else if(expectedScopeType.type == Scope::FUNCTION)
        {
            std::vector<std::vector<std::string>> argumentNames;
            parser.tokenizeFile(parser.extractBracketArguments(newScope.incrementor), argumentNames);
            for(auto iter = argumentNames.rbegin(); iter != argumentNames.rend(); iter++)
            {
                DataType type = stringToDataType((*iter)[0]);
                std::string &identifier = (*iter)[1];
                if(parser.isArrayDefinition(identifier)) //Check if it's an array
                {
                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(identifier, arrayName, arraySize);

                    //Quick error check
                    if(igen.isVariable(arraySize) > 0)
                        throw std::string("Arrays of a dynamic size are not currently supported sorry!");

                    //Get array size as an integer
                    unsigned int aSize = std::stoull(arraySize);
                    if(aSize == 0)
                        throw std::string("Array must not contain no elements");

                    //Create first element with a name
                    igen.push(Variable(arrayName, type));

                    //Set it to an array
                    Variable &var = igen.getVariable(igen.getStackSize()-1);
                    var.isArray = true;
                    var.arrayLength = aSize;

                    //All elements after are unnamed so that when searching for the array, the first element will always be returned
                    for(unsigned int a = 0; a < aSize-1; a++)
                        igen.push(Variable("", type));
                }
                else //Else normal variable
                {
                    igen.push(Variable(identifier, type));
                }
            }
            newScope.argumentCount = argumentNames.size();
            functionCallStack.emplace_back(newScope);
        }
        openScopeStack.emplace_back(newScope);
        scopeDepth++;
    }
    else if(line[0] == "}") //Scope close
    {
        scopeDepth--;
        if(scopeDepth < 0) //No scope to close!
        {
            throw std::string("No such scope to close");
        }

        //Find which scope it is ending
        for(auto iter = openScopeStack.begin(); iter != openScopeStack.end();)
        {
            Scope &current = *iter;

            if(current.scopeDepth == scopeDepth) //We've found the scope that's ending
            {
                if(current.startPos == bytecode.size() && current.type != Scope::FUNCTION) //If the scope was empty, optimise it out
                {
                    bytecode.erase(bytecode.begin() + current.bytecodeSizeBefore, bytecode.end());
                    current.wasOptimisedOut = true;
                    current.endPos = bytecode.size();
                    pastScopes.emplace_back(current);
                    displayWarning("Empty scope. It has been optimised out, but removal is recommended.");
                    return;
                }


                //Called to clear this scope's variables
                auto clearScopeVariables = [&](unsigned int extraAmount = 0)
                {
                    //Remove variables created in the scope IF there's any
                    if(igen.getStackSize() != current.stackSize || extraAmount > 0)
                    {
                        igen.genStackWalk((igen.getStackSize() - current.stackSize) + extraAmount);
                    }
                };

                //Handle the scope end differently depending on its type
                if(current.type == Scope::IF) //If an IF scope is ending
                {
                    clearScopeVariables();

                    //Set the bytecode position to seek to if the IF statement should not run
                    bytecode[current.startPos-1] = bytecode.size()-1;
                }
                else if(current.type == Scope::WHILE) //If a WHILE scope is ending
                {
                    clearScopeVariables();

                    //Add the instructions to loop back around to the beginning of the while
                    igen.genGoto(current.statementPos);
                    bytecode[current.startPos-1] = bytecode.size()-1;
                }
                else if(current.type == Scope::FOR) //If a FOR scope is ending
                {
                    clearScopeVariables();

                    //Parse and insert increment instructions
                    std::vector<std::string> arguments = parser.extractBracketArguments(current.incrementor);
                    std::vector<std::vector<std::string>> initialisationArguments;
                    parser.tokenizeFile({arguments[0]}, initialisationArguments);

                    //Add the instructions to loop back around to the beginning of the for
                    processVariable(initialisationArguments[0]);
                    igen.genGoto(current.statementPos);
                    bytecode[current.startPos-1] = bytecode.size()-1;

                    //Remove initialization variables if needed
                    igen.genStackWalk(current.initialisationVariableCount);
                }
                else if(current.type == Scope::ELSE)
                {
                    clearScopeVariables();

                    Scope &previousScope = pastScopes.back(); // Get preceding scope
                    if(!previousScope.wasOptimisedOut)
                        bytecode[previousScope.endPos-1] = bytecode.size(); //Set the previous if's goto to this point after the else
                }
                else if(current.type == Scope::FUNCTION)
                {
                    //Get scope to return to from function stack
                    Scope endingScope = functionCallStack.back();
                    functionCallStack.pop_back();

                    //Set the function return gotos for this scope
                    while(!functionEndGotos.empty() && functionEndGotos.back().first == functionCallStack.size())
                    {
                        bytecode[functionEndGotos.back().second] = bytecode.size();
                        functionEndGotos.pop_back();
                    }

                    //Erase variables created except the exit point
                    unsigned int variablesToRemove = igen.getStackSize() - endingScope.stackSize;
                    if(variablesToRemove > 0 && endingScope.identifier != "entry") //Only resize if there's things to remove and this isn't the program end
                    {
                        igen.genStackWalk(variablesToRemove);
                    }

                    //Insert the dynamic goto IF it's not the program entry point
                    if(endingScope.identifier != "entry")
                    {
                        igen.push(Variable("returnPoint", DataType::INT));
                        igen.genDynamicGoto();
                    }
                }
                else
                {
                    throw std::string("Ending unknown scope type");
                }

                //Store the scope in pastScopes and erase it from currentScopes as it's no longer open
                current.endPos = bytecode.size();
                if(openScopeStack.size() > 1 && openScopeStack[openScopeStack.size()-2].type == Scope::CLASS) //If scope was created inside of a class, store in that class's past scope list
                {
                    openScopeStack[openScopeStack.size()-2].childMemberScopes.emplace_back(*iter);
                }
                else //Else store in the global past scope list
                {
                    pastScopes.emplace_back(*iter);
                }
                iter = openScopeStack.erase(iter);
                break;
            }
            else
            {
                iter++;
            }

        }
    }
    else
    {
        throw std::string("Error processing scope change, unknown operator '" + line[0] + "'");
    }
}